

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O2

void __thiscall
agge::tests::ArcCurveTests::RewindingArcIteratorStartsOverWithPoints(ArcCurveTests *this)

{
  arc a;
  allocator local_91;
  point local_90;
  point local_80;
  LocationInfo local_70;
  string local_48;
  arc local_28;
  
  arc::arc(&local_28,13.1,-17.2,10.1,0.7853982,4.712389,0.05);
  vertex<agge::arc>(&local_28);
  vertex<agge::arc>(&local_28);
  arc::rewind(&local_28,(FILE *)0x0);
  local_80 = vertex<agge::arc>(&local_28);
  local_90.x = 20.24178;
  local_90.y = -10.058222;
  local_90.command = 1;
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_91);
  ut::LocationInfo::LocationInfo(&local_70,&local_48,0x19b);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,1ul>
            ((point (*) [1])&local_90,(point (*) [1])&local_80,&local_70);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( RewindingArcIteratorStartsOverWithPoints )
			{
				// INIT
				arc a(13.1f, -17.2f, 10.1f, 0.25f * pi, 1.5f * pi);

				vertex(a), vertex(a);

				// ACT
				a.rewind(0);

				// ASSERT
				mocks::path::point points[] = { vertex(a), };
				mocks::path::point reference[] = { moveto(13.1f + 10.1f * sqrtf(2) / 2.0f, -17.2f + 10.1f * sqrtf(2) / 2.0f), };

				assert_equal(reference, points);
			}